

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionDefinition
          (ExpressionContext *ctx,SynBase *source,bool prototype,bool coroutine,TypeBase *parentType
          ,bool accessor,TypeBase *returnType,bool isOperator,SynIdentifier *name,
          IntrusiveList<SynIdentifier> aliases,IntrusiveList<SynFunctionArgument> arguments,
          IntrusiveList<SynBase> expressions,FunctionData *genericProto,TypeFunction *instance,
          IntrusiveList<MatchData> matches)

{
  ScopeData *pSVar1;
  IntrusiveList<ExprVariableDefinition> arguments_00;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<MatchData> generics_00;
  InplaceStr name_00;
  InplaceStr functionName_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  TypeBase *pTVar6;
  MatchData *this;
  ArgumentData *pAVar7;
  SynIdentifier *pSVar8;
  FunctionData *pFVar9;
  SmallArray<ArgumentData,_4U> *this_00;
  SynFunctionDefinition *pSVar10;
  ExprGenericFunctionPrototype *this_01;
  AliasData *this_02;
  SynBase *pSVar11;
  ExprVariableDefinition *contextArgument;
  ExprBase *pEVar12;
  TypeFunction *pTVar13;
  ExprReturn *this_03;
  ExprBase *coroutineStateUpdate;
  SynBase *source_00;
  ExprBase *closures;
  DirectChainedMap<FunctionData_*> *pDVar14;
  VariableData *pVVar15;
  TypeRef *this_04;
  VariableHandle *this_05;
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *this_06;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar16;
  size_t sVar17;
  char *pcVar18;
  ExprFunctionDefinition *this_07;
  InplaceStr IVar19;
  ArrayView<ArgumentData> arguments_01;
  InplaceStr name_01;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<ArgumentData> argData_00;
  SynIdentifier *local_590;
  char *messageEnd;
  char *messageStart;
  char *errorCurr;
  FunctionData *conflict;
  uint local_510;
  uint i_5;
  uint i_4;
  uint i_3;
  IdentifierLookupResult local_4f8;
  TypeClass *local_4e8;
  TypeClass *classType_2;
  TypeRef *refType_1;
  char *local_4d0;
  SynIdentifier *local_4c8;
  SynIdentifier *nameIdentifier_2;
  TypeRef *refType;
  ExprVariableDefinition *contextVariableDefinition;
  VariableData *contextVariable;
  char *local_498;
  char *pos_1;
  TypeClass *typeClass_1;
  InplaceStr parentName;
  SynBase *location;
  SynBase *local_450;
  SynBase *expression;
  char *local_440;
  TypeClass *local_438;
  TypeClass *classType_1;
  SynIdentifier *local_420;
  SynIdentifier *nameIdentifier_1;
  undefined1 auStack_410 [4];
  uint offset;
  IntrusiveList<ExprBase> code;
  ExprBase *coroutineStateRead;
  ExprVariableDefinition *contextArgumentDefinition;
  undefined4 local_3e8;
  undefined1 auStack_3e0 [8];
  IntrusiveList<ExprVariableDefinition> variables;
  MatchData *curr_1;
  IdentifierLookupResult local_3b8;
  InplaceStr local_3a8;
  char *local_398;
  char *pos;
  TypeClass *typeClass;
  char *pcStack_380;
  ArgumentData *local_378;
  ArgumentData *implArg;
  ArgumentData *protoArg;
  FunctionData *pFStack_360;
  uint i_2;
  FunctionData *functionPrototype;
  FunctionData *implementedPrototype;
  SynIdentifier *pSStack_348;
  uint i_1;
  MatchData *pMStack_340;
  FunctionData *local_330;
  FunctionData *function;
  char *pcStack_320;
  SynIdentifier *local_310;
  SynIdentifier *nameIdentifier;
  TypeClass *local_2f8;
  TypeClass *classType;
  VariableData *variable;
  undefined4 local_2e0;
  TypeFunction *local_2d8;
  TypeFunction *functionType;
  uint i;
  char *pcStack_2c0;
  TypeRef *local_2b0;
  TypeBase *contextRefType;
  TraceScope traceScope;
  undefined1 auStack_288 [8];
  InplaceStr functionName;
  undefined4 local_270;
  undefined1 local_230 [8];
  SmallArray<ArgumentData,_8U> argData;
  MatchData *match;
  TypeBase *target;
  SynIdentifier *prev;
  SynIdentifier *curr;
  IntrusiveList<MatchData> generics;
  bool addedParentScope;
  SynBase *errorLocation;
  bool isOperator_local;
  TypeBase *pTStack_50;
  bool accessor_local;
  TypeBase *parentType_local;
  bool coroutine_local;
  bool prototype_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  local_590 = (SynIdentifier *)source;
  if ((name->super_SynBase).begin != (Lexeme *)0x0) {
    local_590 = name;
  }
  generics.tail._7_1_ = RestoreParentTypeScope(ctx,source,parentType);
  pTStack_50 = parentType;
  if ((ctx->scope->ownerType != (TypeBase *)0x0) && (parentType == (TypeBase *)0x0)) {
    pTStack_50 = ctx->scope->ownerType;
  }
  if ((pTStack_50 != (TypeBase *)0x0) && (coroutine)) {
    anon_unknown.dwarf_8df1c::Stop
              (ctx,&local_590->super_SynBase,"ERROR: coroutine cannot be a member function");
  }
  IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&curr);
  for (prev = aliases.head; prev != (SynIdentifier *)0x0;
      prev = getType<SynIdentifier>((prev->super_SynBase).next)) {
    uVar3 = InplaceStr::hash(&prev->name);
    pTVar6 = anon_unknown.dwarf_8df1c::LookupTypeByName(ctx,uVar3);
    if (pTVar6 != (TypeBase *)0x0) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,&prev->super_SynBase,"ERROR: there is already a type with the same name");
    }
    for (target = (TypeBase *)aliases.head; target != (TypeBase *)0x0 && target != (TypeBase *)prev;
        target = (TypeBase *)getType<SynIdentifier>((SynBase *)target->size)) {
      bVar2 = InplaceStr::operator==((InplaceStr *)&target->refType,&prev->name);
      if (bVar2) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,&prev->super_SynBase,"ERROR: there is already an alias with the same name");
      }
    }
    match = (MatchData *)0x0;
    for (argData.allocator = (Allocator *)matches.head; argData.allocator != (Allocator *)0x0;
        argData.allocator = (Allocator *)argData.allocator[2]._vptr_Allocator) {
      bVar2 = InplaceStr::operator==
                        (&prev->name,(InplaceStr *)((argData.allocator)->_vptr_Allocator + 8));
      if (bVar2) {
        match = (MatchData *)argData.allocator[1]._vptr_Allocator;
        break;
      }
    }
    if (match == (MatchData *)0x0) {
      match = (MatchData *)ExpressionContext::GetGenericAliasType(ctx,prev);
    }
    this = ExpressionContext::get<MatchData>(ctx);
    MatchData::MatchData(this,prev,(TypeBase *)match);
    IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)&curr,this);
  }
  SmallArray<ArgumentData,_8U>::SmallArray((SmallArray<ArgumentData,_8U> *)local_230,ctx->allocator)
  ;
  AnalyzeFunctionDefinitionArguments
            (ctx,arguments,pTStack_50,instance,(SmallArray<ArgumentData,_8U> *)local_230);
  if (isOperator) {
    IVar19 = name->name;
    ArrayView<ArgumentData>::ArrayView<8u>
              ((ArrayView<ArgumentData> *)&functionName.end,
               (SmallArray<ArgumentData,_8U> *)local_230);
    argData_00._12_4_ = 0;
    argData_00.data = (ArgumentData *)functionName.end;
    argData_00.count = local_270;
    CheckOperatorName(ctx,source,IVar19,argData_00);
  }
  if ((accessor) && (bVar2 = InplaceStr::operator==(&name->name,&pTStack_50->name), bVar2)) {
    anon_unknown.dwarf_8df1c::Stop
              (ctx,&local_590->super_SynBase,"ERROR: name \'%.*s\' is already taken for a type",
               (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
  }
  traceScope._8_8_ = (name->name).begin;
  IVar19 = GetFunctionName(ctx,ctx->scope,pTStack_50,name->name,isOperator,accessor);
  functionName.begin = IVar19.end;
  auStack_288 = (undefined1  [8])IVar19.begin;
  if (CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
      ::token == '\0') {
    iVar4 = __cxa_guard_acquire(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                                 ::token);
    IVar19.end = functionName.begin;
    IVar19.begin = (char *)auStack_288;
    if (iVar4 != 0) {
      CreateFunctionDefinition::token = NULLC::TraceGetToken("analyze","CreateFunctionDefinition");
      __cxa_guard_release(&CreateFunctionDefinition(ExpressionContext&,SynBase*,bool,bool,TypeBase*,bool,TypeBase*,bool,SynIdentifier*,IntrusiveList<SynIdentifier>,IntrusiveList<SynFunctionArgument>,IntrusiveList<SynBase>,FunctionData*,TypeFunction*,IntrusiveList<MatchData>)
                           ::token);
      IVar19.end = functionName.begin;
      IVar19.begin = (char *)auStack_288;
    }
  }
  functionName.begin = IVar19.end;
  auStack_288 = (undefined1  [8])IVar19.begin;
  NULLC::TraceScope::TraceScope((TraceScope *)&contextRefType,CreateFunctionDefinition::token);
  NULLC::TraceLabel((char *)auStack_288,functionName.begin);
  local_2b0 = (TypeRef *)0x0;
  if (pTStack_50 == (TypeBase *)0x0) {
    if ((coroutine) ||
       ((ctx->scope != ctx->globalScope && (ctx->scope->ownerNamespace == (NamespaceData *)0x0)))) {
      _i = (FunctionData *)auStack_288;
      pcStack_2c0 = functionName.begin;
      functionName_00.end = functionName.begin;
      functionName_00.begin = (char *)auStack_288;
      pTVar6 = CreateFunctionContextType(ctx,source,functionName_00);
      local_2b0 = ExpressionContext::GetReferenceType(ctx,pTVar6);
    }
    else {
      local_2b0 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    }
  }
  else {
    local_2b0 = ExpressionContext::GetReferenceType(ctx,pTStack_50);
  }
  bVar2 = isType<TypeError>(returnType);
  if (bVar2) {
    if ((generics.tail._7_1_ & 1) != 0) {
      ExpressionContext::PopScope(ctx,SCOPE_TYPE);
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
    pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError((ExprError *)ctx_local,source,pTVar6);
  }
  else {
    for (functionType._0_4_ = 0; uVar3 = (uint)functionType,
        uVar5 = SmallArray<ArgumentData,_8U>::size((SmallArray<ArgumentData,_8U> *)local_230),
        uVar3 < uVar5; functionType._0_4_ = (uint)functionType + 1) {
      pAVar7 = SmallArray<ArgumentData,_8U>::operator[]
                         ((SmallArray<ArgumentData,_8U> *)local_230,(uint)functionType);
      bVar2 = isType<TypeError>(pAVar7->type);
      if (bVar2) {
        if ((generics.tail._7_1_ & 1) != 0) {
          ExpressionContext::PopScope(ctx,SCOPE_TYPE);
        }
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
        pTVar6 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprError::ExprError((ExprError *)ctx_local,source,pTVar6);
        goto LAB_001d14ad;
      }
    }
    ArrayView<ArgumentData>::ArrayView<8u>
              ((ArrayView<ArgumentData> *)&variable,(SmallArray<ArgumentData,_8U> *)local_230);
    arguments_01._12_4_ = 0;
    arguments_01.data = (ArgumentData *)variable;
    arguments_01.count = local_2e0;
    local_2d8 = ExpressionContext::GetFunctionType(ctx,source,returnType,arguments_01);
    if ((instance != (TypeFunction *)0x0) && (local_2d8 != instance)) {
      __assert_fail("functionType == instance",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x236c,
                    "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                   );
    }
    uVar3 = InplaceStr::hash((InplaceStr *)auStack_288);
    classType = (TypeClass *)anon_unknown.dwarf_8df1c::LookupVariableByName(ctx,uVar3);
    if ((classType != (TypeClass *)0x0) &&
       ((ScopeData *)(classType->super_TypeStruct).super_TypeBase.name.begin == ctx->scope)) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,&local_590->super_SynBase,
                 "ERROR: name \'%.*s\' is already taken for a variable in current scope",
                 (ulong)(uint)(*(int *)&(name->name).end - (int)(name->name).begin));
    }
    local_2f8 = getType<TypeClass>(pTStack_50);
    if (local_2f8 != (TypeClass *)0x0) {
      InplaceStr::InplaceStr((InplaceStr *)&nameIdentifier,"finalize");
      bVar2 = InplaceStr::operator==(&name->name,(InplaceStr *)&nameIdentifier);
      if (bVar2) {
        local_2f8->hasFinalizer = true;
      }
    }
    pSVar8 = ExpressionContext::get<SynIdentifier>(ctx);
    function = (FunctionData *)auStack_288;
    pcStack_320 = functionName.begin;
    name_00.end = functionName.begin;
    name_00.begin = (char *)auStack_288;
    SynIdentifier::SynIdentifier(pSVar8,name,name_00);
    local_310 = pSVar8;
    pFVar9 = ExpressionContext::get<FunctionData>(ctx);
    pSStack_348 = curr;
    pMStack_340 = generics.head;
    uVar3 = ctx->uniqueFunctionId;
    ctx->uniqueFunctionId = uVar3 + 1;
    pcVar18 = (char *)(ulong)(coroutine & 1);
    generics_00.tail = generics.head;
    generics_00.head = (MatchData *)curr;
    FunctionData::FunctionData
              (pFVar9,ctx->allocator,source,ctx->scope,SUB41(coroutine & 1,0),accessor,isOperator,
               local_2d8,&local_2b0->super_TypeBase,local_310,generics_00,uVar3);
    (pFVar9->aliases).head = matches.head;
    (pFVar9->aliases).tail = matches.tail;
    local_330 = pFVar9;
    for (implementedPrototype._4_4_ = 0; uVar3 = implementedPrototype._4_4_,
        uVar5 = SmallArray<ArgumentData,_8U>::size((SmallArray<ArgumentData,_8U> *)local_230),
        uVar3 < uVar5; implementedPrototype._4_4_ = implementedPrototype._4_4_ + 1) {
      this_00 = &local_330->arguments;
      pAVar7 = SmallArray<ArgumentData,_8U>::operator[]
                         ((SmallArray<ArgumentData,_8U> *)local_230,implementedPrototype._4_4_);
      SmallArray<ArgumentData,_4U>::push_back(this_00,pAVar7);
    }
    functionPrototype = (FunctionData *)0x0;
    if ((local_2d8->returnType != ctx->typeAuto) &&
       (pFStack_360 = anon_unknown.dwarf_8df1c::ImplementPrototype(ctx,local_330),
       pFStack_360 != (FunctionData *)0x0)) {
      if (prototype) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,&local_590->super_SynBase,"ERROR: function is already defined");
      }
      if ((coroutine) && ((pFStack_360->coroutine & 1U) == 0)) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,&local_590->super_SynBase,"ERROR: function prototype was not a coroutine");
      }
      if ((!coroutine) && ((pFStack_360->coroutine & 1U) != 0)) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,&local_590->super_SynBase,"ERROR: function prototype was a coroutine");
      }
      local_330->contextType = pFStack_360->contextType;
      for (protoArg._4_4_ = 0; uVar3 = protoArg._4_4_,
          uVar5 = SmallArray<ArgumentData,_4U>::size(&local_330->arguments), uVar3 < uVar5;
          protoArg._4_4_ = protoArg._4_4_ + 1) {
        implArg = SmallArray<ArgumentData,_4U>::operator[](&pFStack_360->arguments,protoArg._4_4_);
        local_378 = SmallArray<ArgumentData,_4U>::operator[](&local_330->arguments,protoArg._4_4_);
        if (implArg->value != (ExprBase *)0x0) {
          if (local_378->value == (ExprBase *)0x0) {
            local_378->value = implArg->value;
          }
          else {
            anon_unknown.dwarf_8df1c::Report
                      (ctx,&local_590->super_SynBase,
                       "ERROR: function prototype already has a default value for argument #%d",
                       (ulong)(protoArg._4_4_ + 1));
          }
        }
      }
      functionPrototype = pFStack_360;
    }
    typeClass = (TypeClass *)(local_330->name->name).begin;
    pcStack_380 = (local_330->name->name).end;
    name_01.end = pcVar18;
    name_01.begin = pcStack_380;
    anon_unknown.dwarf_8df1c::CheckFunctionConflict
              ((anon_unknown_dwarf_8df1c *)ctx,(ExpressionContext *)source,(SynBase *)typeClass,
               name_01);
    ExpressionContext::AddFunction(ctx,local_330);
    bVar2 = ExpressionContext::IsGenericFunction(ctx,local_330);
    if (bVar2) {
      if (instance != (TypeFunction *)0x0) {
        __assert_fail("!instance",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x23af,
                      "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                     );
      }
      if (prototype) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,&local_590->super_SynBase,
                   "ERROR: generic function cannot be forward-declared");
      }
      if ((generics.tail._7_1_ & 1) != 0) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE);
      }
      bVar2 = isType<SynFunctionDefinition>(source);
      if (!bVar2) {
        __assert_fail("isType<SynFunctionDefinition>(source)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x23b7,
                      "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                     );
      }
      pSVar10 = getType<SynFunctionDefinition>(source);
      local_330->definition = pSVar10;
      this_01 = ExpressionContext::get<ExprGenericFunctionPrototype>(ctx);
      ExprGenericFunctionPrototype::ExprGenericFunctionPrototype
                (this_01,source,&local_330->type->super_TypeBase,local_330);
      local_330->declaration = &this_01->super_ExprBase;
      pos = (char *)getType<TypeClass>(pTStack_50);
      if (((TypeClass *)pos != (TypeClass *)0x0) &&
         (local_398 = strstr((local_330->name->name).begin,"::"), local_398 != (char *)0x0)) {
        SmallArray<FunctionData_*,_4U>::push_back
                  ((SmallArray<FunctionData_*,_4U> *)(pos + 0x130),&local_330);
        pDVar14 = (DirectChainedMap<FunctionData_*> *)(pos + 0x168);
        InplaceStr::InplaceStr(&local_3a8,local_398 + 2);
        uVar3 = InplaceStr::hash(&local_3a8);
        DirectChainedMap<FunctionData_*>::insert(pDVar14,uVar3,local_330);
      }
      ctx_local = (ExpressionContext *)local_330->declaration;
    }
    else {
      if (isOperator) {
        if ((ctx->scope->type == SCOPE_TYPE) || (ctx->scope->type == SCOPE_NAMESPACE)) {
          pSVar1 = ctx->globalScope;
          uVar3 = local_330->nameHash;
          IdentifierLookupResult::IdentifierLookupResult(&local_3b8,local_330);
          DirectChainedMap<IdentifierLookupResult>::remove
                    (&pSVar1->idLookupMap,(char *)(ulong)uVar3);
        }
        else {
          pSVar1 = ctx->scope;
          uVar3 = local_330->nameHash;
          IdentifierLookupResult::IdentifierLookupResult
                    ((IdentifierLookupResult *)&curr_1,local_330);
          DirectChainedMap<IdentifierLookupResult>::remove
                    (&pSVar1->idLookupMap,(char *)(ulong)uVar3);
        }
      }
      if (genericProto != (FunctionData *)0x0) {
        local_330->proto = genericProto;
        SmallArray<FunctionData_*,_8U>::push_back(&genericProto->instances,&local_330);
      }
      ExpressionContext::PushScope(ctx,local_330);
      local_330->functionScope = ctx->scope;
      for (variables.tail = (ExprVariableDefinition *)(local_330->aliases).head;
          variables.tail != (ExprVariableDefinition *)0x0;
          variables.tail = (ExprVariableDefinition *)((variables.tail)->super_ExprBase).source) {
        this_02 = ExpressionContext::get<AliasData>(ctx);
        pSVar8 = (SynIdentifier *)((variables.tail)->super_ExprBase)._vptr_ExprBase;
        pTVar6 = *(TypeBase **)&((variables.tail)->super_ExprBase).typeID;
        uVar3 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar3 + 1;
        AliasData::AliasData(this_02,source,ctx->scope,pTVar6,pSVar8,uVar3);
        ExpressionContext::AddAlias(ctx,this_02);
      }
      IntrusiveList<ExprVariableDefinition>::IntrusiveList
                ((IntrusiveList<ExprVariableDefinition> *)auStack_3e0);
      pFVar9 = local_330;
      ArrayView<ArgumentData>::ArrayView<8u>
                ((ArrayView<ArgumentData> *)&contextArgumentDefinition,
                 (SmallArray<ArgumentData,_8U> *)local_230);
      arguments_02._12_4_ = 0;
      arguments_02.data = (ArgumentData *)contextArgumentDefinition;
      arguments_02.count = local_3e8;
      CreateFunctionArgumentVariables
                (ctx,source,pFVar9,arguments_02,(IntrusiveList<ExprVariableDefinition> *)auStack_3e0
                );
      pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      contextArgument = CreateFunctionContextArgument(ctx,pSVar11,local_330);
      local_330->argumentsSize = local_330->functionScope->dataSize;
      code.tail = (ExprBase *)0x0;
      IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_410);
      if (prototype) {
        if (local_330->type->returnType == ctx->typeAuto) {
          anon_unknown.dwarf_8df1c::Stop
                    (ctx,&local_590->super_SynBase,
                     "ERROR: function prototype with unresolved return type");
        }
        local_330->isPrototype = true;
      }
      else {
        if ((local_330->coroutine & 1U) != 0) {
          nameIdentifier_1._4_4_ =
               anon_unknown.dwarf_8df1c::AllocateVariableInScope
                         (ctx,source,ctx->typeInt->alignment,ctx->typeInt);
          pSVar8 = ExpressionContext::get<SynIdentifier>(ctx);
          InplaceStr::InplaceStr((InplaceStr *)&classType_1,"$jmpOffset");
          SynIdentifier::SynIdentifier(pSVar8,_classType_1);
          local_420 = pSVar8;
          pVVar15 = ExpressionContext::get<VariableData>(ctx);
          uVar3 = ctx->uniqueVariableId;
          ctx->uniqueVariableId = uVar3 + 1;
          VariableData::VariableData
                    (pVVar15,ctx->allocator,source,ctx->scope,0,ctx->typeInt,local_420,
                     nameIdentifier_1._4_4_,uVar3);
          local_330->coroutineJumpOffset = pVVar15;
          bVar2 = anon_unknown.dwarf_8df1c::IsLookupOnlyVariable(ctx,local_330->coroutineJumpOffset)
          ;
          if (bVar2) {
            local_330->coroutineJumpOffset->lookupOnly = true;
          }
          ExpressionContext::AddVariable(ctx,local_330->coroutineJumpOffset,false);
          AddFunctionCoroutineVariable(ctx,source,local_330,local_330->coroutineJumpOffset);
          code.tail = CreateVariableAccess(ctx,source,local_330->coroutineJumpOffset,true);
        }
        local_438 = getType<TypeClass>(local_330->scope->ownerType);
        if (local_438 != (TypeClass *)0x0) {
          IVar19 = GetTypeConstructorName(local_438);
          local_440 = IVar19.end;
          expression = (SynBase *)IVar19.begin;
          bVar2 = InplaceStr::operator==((InplaceStr *)&expression,&name->name);
          if (bVar2) {
            CreateDefaultConstructorCode
                      (ctx,source,local_438,(IntrusiveList<ExprBase> *)auStack_410);
          }
        }
        for (local_450 = expressions.head; local_450 != (SynBase *)0x0; local_450 = local_450->next)
        {
          pEVar12 = AnalyzeStatement(ctx,local_450);
          IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)auStack_410,pEVar12);
        }
        if (local_330->type->returnType == ctx->typeAuto) {
          pTVar13 = ExpressionContext::GetFunctionType
                              (ctx,source,ctx->typeVoid,local_330->type->arguments);
          local_330->type = pTVar13;
        }
        if ((local_330->type->returnType != ctx->typeVoid) &&
           ((local_330->hasExplicitReturn & 1U) == 0)) {
          anon_unknown.dwarf_8df1c::Report
                    (ctx,&local_590->super_SynBase,
                     "ERROR: function must return a value of type \'%.*s\'",
                     (ulong)(uint)(*(int *)&(returnType->name).end - (int)(returnType->name).begin))
          ;
        }
        if (local_330->type->returnType == ctx->typeVoid) {
          pSVar11 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
          this_03 = ExpressionContext::get<ExprReturn>(ctx);
          pTVar6 = ctx->typeVoid;
          pEVar12 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
          ExprVoid::ExprVoid((ExprVoid *)pEVar12,pSVar11,ctx->typeVoid);
          coroutineStateUpdate = CreateFunctionCoroutineStateUpdate(ctx,pSVar11,local_330,0);
          source_00 = &ExpressionContext::MakeInternal(ctx,pSVar11)->super_SynBase;
          closures = CreateFunctionUpvalueClose(ctx,source_00,local_330,ctx->scope);
          ExprReturn::ExprReturn(this_03,pSVar11,pTVar6,pEVar12,coroutineStateUpdate,closures);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)auStack_410,&this_03->super_ExprBase);
        }
      }
      ClosePendingUpvalues(ctx,local_330);
      ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
      if ((generics.tail._7_1_ & 1) != 0) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE);
      }
      if (pTStack_50 != (TypeBase *)0x0) {
        typeClass_1 = (TypeClass *)(pTStack_50->name).begin;
        parentName.begin = (pTStack_50->name).end;
        pos_1 = (char *)getType<TypeClass>(pTStack_50);
        if ((TypeClass *)pos_1 != (TypeClass *)0x0) {
          if (((TypeClass *)pos_1)->proto != (TypeGenericClassProto *)0x0) {
            typeClass_1 = (TypeClass *)(((TypeClass *)pos_1)->proto->super_TypeBase).name.begin;
            parentName.begin = (((TypeClass *)pos_1)->proto->super_TypeBase).name.end;
          }
          local_498 = strstr((local_330->name->name).begin,"::");
          if (local_498 != (char *)0x0) {
            SmallArray<FunctionData_*,_4U>::push_back
                      ((SmallArray<FunctionData_*,_4U> *)(pos_1 + 0x130),&local_330);
            pDVar14 = (DirectChainedMap<FunctionData_*> *)(pos_1 + 0x168);
            InplaceStr::InplaceStr((InplaceStr *)&contextVariable,local_498 + 2);
            uVar3 = InplaceStr::hash((InplaceStr *)&contextVariable);
            DirectChainedMap<FunctionData_*>::insert(pDVar14,uVar3,local_330);
          }
        }
        bVar2 = InplaceStr::operator==(&name->name,(InplaceStr *)&typeClass_1);
        if ((bVar2) && (local_330->type->returnType != ctx->typeVoid)) {
          anon_unknown.dwarf_8df1c::Stop
                    (ctx,&local_590->super_SynBase,
                     "ERROR: type constructor return type must be \'void\'");
        }
      }
      contextVariableDefinition = (ExprVariableDefinition *)0x0;
      refType = (TypeRef *)0x0;
      if (pTStack_50 == (TypeBase *)0x0) {
        if ((coroutine) ||
           ((ctx->scope != ctx->globalScope && (ctx->scope->ownerNamespace == (NamespaceData *)0x0))
           )) {
          if (prototype) {
            nameIdentifier_2 = (SynIdentifier *)getType<TypeRef>(local_330->contextType);
            if ((TypeRef *)nameIdentifier_2 == (TypeRef *)0x0) {
              __assert_fail("refType",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x244c,
                            "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                           );
            }
            pSVar8 = ExpressionContext::get<SynIdentifier>(ctx);
            pFVar9 = local_330;
            uVar3 = ExpressionContext::GetFunctionIndex(ctx,local_330);
            IVar19 = GetFunctionContextVariableName(ctx,pFVar9,uVar3);
            local_4d0 = IVar19.end;
            refType_1 = (TypeRef *)IVar19.begin;
            SynIdentifier::SynIdentifier(pSVar8,IVar19);
            local_4c8 = pSVar8;
            pVVar15 = ExpressionContext::get<VariableData>(ctx);
            uVar3 = *(uint *)((long)&(nameIdentifier_2->super_SynBase).pos.end + 4);
            uVar5 = ctx->uniqueVariableId;
            ctx->uniqueVariableId = uVar5 + 1;
            VariableData::VariableData
                      (pVVar15,ctx->allocator,source,ctx->scope,uVar3,(TypeBase *)nameIdentifier_2,
                       local_4c8,0,uVar5);
            pVVar15->isAlloca = true;
            pVVar15->offset = 0xffffffff;
            contextVariableDefinition = (ExprVariableDefinition *)pVVar15;
            ExpressionContext::AddVariable(ctx,pVVar15,true);
            this_04 = (TypeRef *)ExpressionContext::get<ExprVariableDefinition>(ctx);
            pTVar6 = ctx->typeVoid;
            this_05 = ExpressionContext::get<VariableHandle>(ctx);
            VariableHandle::VariableHandle
                      (this_05,(SynBase *)0x0,(VariableData *)contextVariableDefinition);
            ExprVariableDefinition::ExprVariableDefinition
                      ((ExprVariableDefinition *)this_04,source,pTVar6,this_05,(ExprBase *)0x0);
            refType = this_04;
          }
          else {
            contextVariableDefinition =
                 (ExprVariableDefinition *)
                 CreateFunctionContextVariable(ctx,source,local_330,functionPrototype);
            refType = (TypeRef *)
                      CreateFunctionContextVariableDefinition
                                (ctx,source,local_330,functionPrototype,
                                 (VariableData *)contextVariableDefinition);
          }
        }
        else {
          refType = (TypeRef *)0x0;
        }
      }
      else {
        refType = (TypeRef *)0x0;
      }
      pFVar9 = anon_unknown.dwarf_8df1c::ImplementPrototype(ctx,local_330);
      if (pFVar9 != (FunctionData *)0x0) {
        classType_2 = (TypeClass *)getType<TypeRef>(local_330->contextType);
        if (classType_2 == (TypeClass *)0x0) {
          __assert_fail("refType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x2466,
                        "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                       );
        }
        if ((classType_2->super_TypeStruct).typeScope != (ScopeData *)ctx->typeVoid) {
          local_4e8 = getType<TypeClass>((TypeBase *)(classType_2->super_TypeStruct).typeScope);
          if (local_4e8 == (TypeClass *)0x0) {
            __assert_fail("classType",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x246c,
                          "ExprBase *CreateFunctionDefinition(ExpressionContext &, SynBase *, bool, bool, TypeBase *, bool, TypeBase *, bool, SynIdentifier *, IntrusiveList<SynIdentifier>, IntrusiveList<SynFunctionArgument>, IntrusiveList<SynBase>, FunctionData *, TypeFunction *, IntrusiveList<MatchData>)"
                         );
          }
          bVar2 = IntrusiveList<MemberHandle>::empty(&(local_4e8->super_TypeStruct).members);
          if (!bVar2) {
            anon_unknown.dwarf_8df1c::Report
                      (ctx,&local_590->super_SynBase,
                       "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                       (ulong)(uint)(*(int *)&(local_330->name->name).end -
                                    (int)(local_330->name->name).begin));
          }
        }
      }
      if (isOperator) {
        if ((ctx->scope->type == SCOPE_TYPE) || (ctx->scope->type == SCOPE_NAMESPACE)) {
          pSVar1 = ctx->globalScope;
          uVar3 = InplaceStr::hash(&local_330->name->name);
          IdentifierLookupResult::IdentifierLookupResult(&local_4f8,local_330);
          DirectChainedMap<IdentifierLookupResult>::insert(&pSVar1->idLookupMap,uVar3,local_4f8);
        }
        else {
          pSVar1 = ctx->scope;
          uVar3 = local_330->nameHash;
          IdentifierLookupResult::IdentifierLookupResult((IdentifierLookupResult *)&i_4,local_330);
          DirectChainedMap<IdentifierLookupResult>::insert(&pSVar1->idLookupMap,uVar3,_i_4);
        }
        SmallDenseSet<TypePair,_TypePairHasher,_32U>::clear(&ctx->noAssignmentOperatorForTypePair);
        SmallDenseSet<TypePair,_TypePairHasher,_32U>::clear(&ctx->noIndexOperatorForTypePair);
        for (i_5 = 0; uVar3 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::size
                                        (&ctx->noUnaryOperatorForTypePair), i_5 < uVar3;
            i_5 = i_5 + 1) {
          this_06 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                              (&ctx->noUnaryOperatorForTypePair,i_5);
          SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::clear(this_06);
        }
        for (local_510 = 0;
            uVar3 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::size
                              (&ctx->noBinaryOperatorForTypePair), local_510 < uVar3;
            local_510 = local_510 + 1) {
          pSVar16 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                              (&ctx->noBinaryOperatorForTypePair,local_510);
          SmallDenseSet<TypePair,_TypePairHasher,_4U>::clear(pSVar16);
        }
        for (conflict._4_4_ = 0;
            uVar3 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::size
                              (&ctx->noModifyOperatorForTypePair), conflict._4_4_ < uVar3;
            conflict._4_4_ = conflict._4_4_ + 1) {
          pSVar16 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_11U>::operator[]
                              (&ctx->noModifyOperatorForTypePair,conflict._4_4_);
          SmallDenseSet<TypePair,_TypePairHasher,_4U>::clear(pSVar16);
        }
      }
      pFVar9 = anon_unknown.dwarf_8df1c::CheckUniqueness(ctx,local_330);
      if (pFVar9 != (FunctionData *)0x0) {
        anon_unknown.dwarf_8df1c::Report
                  (ctx,&local_590->super_SynBase,
                   "ERROR: function \'%.*s\' is being defined with the same set of arguments",
                   (ulong)(uint)(*(int *)&(local_330->name->name).end -
                                (int)(local_330->name->name).begin));
        pcVar18 = ctx->errorBuf;
        sVar17 = strlen(pcVar18);
        pcVar18 = pcVar18 + sVar17;
        iVar4 = NULLC::SafeSprintf(pcVar18,(ulong)(ctx->errorBufSize +
                                                  (*(int *)&ctx->errorBuf - (int)pcVar18)),
                                   "previous definition here");
        anon_unknown.dwarf_8df1c::AddRelatedErrorInfoWithLocation
                  (ctx,pFVar9->source,pcVar18,pcVar18 + iVar4);
      }
      this_07 = ExpressionContext::get<ExprFunctionDefinition>(ctx);
      arguments_00.tail._0_4_ = (int)variables.head;
      arguments_00.head = (ExprVariableDefinition *)auStack_3e0;
      arguments_00.tail._4_4_ = (int)((ulong)variables.head >> 0x20);
      expressions_00.tail = code.head;
      expressions_00.head = _auStack_410;
      ExprFunctionDefinition::ExprFunctionDefinition
                (this_07,source,&local_330->type->super_TypeBase,local_330,contextArgument,
                 arguments_00,code.tail,expressions_00,(ExprVariableDefinition *)refType,
                 (VariableData *)contextVariableDefinition);
      local_330->declaration = &this_07->super_ExprBase;
      SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&local_330->declaration);
      ctx_local = (ExpressionContext *)local_330->declaration;
    }
  }
LAB_001d14ad:
  functionType._4_4_ = 1;
  NULLC::TraceScope::~TraceScope((TraceScope *)&contextRefType);
  SmallArray<ArgumentData,_8U>::~SmallArray((SmallArray<ArgumentData,_8U> *)local_230);
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateFunctionDefinition(ExpressionContext &ctx, SynBase *source, bool prototype, bool coroutine, TypeBase *parentType, bool accessor, TypeBase *returnType, bool isOperator, SynIdentifier *name, IntrusiveList<SynIdentifier> aliases, IntrusiveList<SynFunctionArgument> arguments, IntrusiveList<SynBase> expressions, FunctionData *genericProto, TypeFunction *instance, IntrusiveList<MatchData> matches)
{
	SynBase *errorLocation = name->begin ? name : source;

	bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

	if(ctx.scope->ownerType && !parentType)
		parentType = ctx.scope->ownerType;

	if(parentType && coroutine)
		Stop(ctx, errorLocation, "ERROR: coroutine cannot be a member function");

	IntrusiveList<MatchData> generics;

	for(SynIdentifier *curr = aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
	{
		if(LookupTypeByName(ctx, curr->name.hash()))
			Stop(ctx, curr, "ERROR: there is already a type with the same name");

		for(SynIdentifier *prev = aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
		{
			if(prev->name == curr->name)
				Stop(ctx, curr, "ERROR: there is already an alias with the same name");
		}

		TypeBase *target = NULL;

		for(MatchData *match = matches.head; match; match = match->next)
		{
			if(curr->name == match->name->name)
			{
				target = match->type;
				break;
			}
		}

		if(!target)
			target = ctx.GetGenericAliasType(curr);

		generics.push_back(new (ctx.get<MatchData>()) MatchData(curr, target));
	}

	SmallArray<ArgumentData, 8> argData(ctx.allocator);

	AnalyzeFunctionDefinitionArguments(ctx, arguments, parentType, instance, argData);

	// Check required operator properties
	if(isOperator)
		CheckOperatorName(ctx, source, name->name, argData);

	if(accessor && name->name == parentType->name)
		Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a type", FMT_ISTR(name->name));

	InplaceStr functionName = GetFunctionName(ctx, ctx.scope, parentType, name->name, isOperator, accessor);

	TRACE_SCOPE("analyze", "CreateFunctionDefinition");
	TRACE_LABEL2(functionName.begin, functionName.end);

	TypeBase *contextRefType = NULL;

	if(parentType)
		contextRefType = ctx.GetReferenceType(parentType);
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
		contextRefType = ctx.GetReferenceType(ctx.typeVoid);
	else
		contextRefType = ctx.GetReferenceType(CreateFunctionContextType(ctx, source, functionName));

	if(isType<TypeError>(returnType))
	{
		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	for(unsigned i = 0; i < argData.size(); i++)
	{
		if(isType<TypeError>(argData[i].type))
		{
			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);

			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
		}
	}

	TypeFunction *functionType = ctx.GetFunctionType(source, returnType, argData);

	if(instance)
		assert(functionType == instance);

	if(VariableData *variable = LookupVariableByName(ctx, functionName.hash()))
	{
		if(variable->scope == ctx.scope)
			Stop(ctx, errorLocation, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name->name));
	}

	if(TypeClass *classType = getType<TypeClass>(parentType))
	{
		if(name->name == InplaceStr("finalize"))
			classType->hasFinalizer = true;
	}

	SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name, functionName);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, coroutine, accessor, isOperator, functionType, contextRefType, nameIdentifier, generics, ctx.uniqueFunctionId++);

	function->aliases = matches;

	// Fill in argument data
	for(unsigned i = 0; i < argData.size(); i++)
		function->arguments.push_back(argData[i]);

	FunctionData *implementedPrototype = NULL;

	// If the type is known, implement the prototype immediately
	if(functionType->returnType != ctx.typeAuto)
	{
		if(FunctionData *functionPrototype = ImplementPrototype(ctx, function))
		{
			if(prototype)
				Stop(ctx, errorLocation, "ERROR: function is already defined");

			if(coroutine && !functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was not a coroutine");

			if(!coroutine && functionPrototype->coroutine)
				Stop(ctx, errorLocation, "ERROR: function prototype was a coroutine");

			function->contextType = functionPrototype->contextType;

			// Assign default function arguments
			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &protoArg = functionPrototype->arguments[i];
				ArgumentData &implArg = function->arguments[i];

				if(protoArg.value)
				{
					if(!implArg.value)
						implArg.value = protoArg.value;
					else
						Report(ctx, errorLocation, "ERROR: function prototype already has a default value for argument #%d", i + 1);
				}
			}

			implementedPrototype = functionPrototype;
		}
	}

	CheckFunctionConflict(ctx, source, function->name->name);

	ctx.AddFunction(function);

	if(ctx.IsGenericFunction(function))
	{
		assert(!instance);

		if(prototype)
			Stop(ctx, errorLocation, "ERROR: generic function cannot be forward-declared");

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		assert(isType<SynFunctionDefinition>(source));

		function->definition = getType<SynFunctionDefinition>(source);
		function->declaration = new (ctx.get<ExprGenericFunctionPrototype>()) ExprGenericFunctionPrototype(source, function->type, function);

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		return function->declaration;
	}

	// Operator overloads can't be called recursively and become available at the end of the definition
	if (isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.remove(function->nameHash, IdentifierLookupResult(function));
	}

	if(genericProto)
	{
		function->proto = genericProto;

		genericProto->instances.push_back(function);
	}

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	for(MatchData *curr = function->aliases.head; curr; curr = curr->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(source, ctx.scope, curr->type, curr->name, ctx.uniqueAliasId++));

	IntrusiveList<ExprVariableDefinition> variables;

	CreateFunctionArgumentVariables(ctx, source, function, argData, variables);

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

	function->argumentsSize = function->functionScope->dataSize;

	ExprBase *coroutineStateRead = NULL;

	IntrusiveList<ExprBase> code;

	if(prototype)
	{
		if(function->type->returnType == ctx.typeAuto)
			Stop(ctx, errorLocation, "ERROR: function prototype with unresolved return type");

		function->isPrototype = true;
	}
	else
	{
		if(function->coroutine)
		{
			unsigned offset = AllocateVariableInScope(ctx, source, ctx.typeInt->alignment, ctx.typeInt);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$jmpOffset"));

			function->coroutineJumpOffset = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, ctx.typeInt, nameIdentifier, offset, ctx.uniqueVariableId++);

			if (IsLookupOnlyVariable(ctx, function->coroutineJumpOffset))
				function->coroutineJumpOffset->lookupOnly = true;

			ctx.AddVariable(function->coroutineJumpOffset, false);

			AddFunctionCoroutineVariable(ctx, source, function, function->coroutineJumpOffset);

			coroutineStateRead = CreateVariableAccess(ctx, source, function->coroutineJumpOffset, true);
		}

		// If this is a custom default constructor, add a prolog
		if(TypeClass *classType = getType<TypeClass>(function->scope->ownerType))
		{
			if(GetTypeConstructorName(classType) == name->name)
				CreateDefaultConstructorCode(ctx, source, classType, code);
		}

		for(SynBase *expression = expressions.head; expression; expression = expression->next)
			code.push_back(AnalyzeStatement(ctx, expression));

		// If the function type is still auto it means that it hasn't returned anything
		if(function->type->returnType == ctx.typeAuto)
			function->type = ctx.GetFunctionType(source, ctx.typeVoid, function->type->arguments);

		if(function->type->returnType != ctx.typeVoid && !function->hasExplicitReturn)
			Report(ctx, errorLocation, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		// User might have not returned from all control paths, for a void function we will generate a return
		if(function->type->returnType == ctx.typeVoid)
		{
			SynBase *location = ctx.MakeInternal(source);

			code.push_back(new (ctx.get<ExprReturn>()) ExprReturn(location, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(location, ctx.typeVoid), CreateFunctionCoroutineStateUpdate(ctx, location, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(location), function, ctx.scope)));
		}
	}

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	if(addedParentScope)
		ctx.PopScope(SCOPE_TYPE);

	if(parentType)
	{
		InplaceStr parentName = parentType->name;

		if(TypeClass *typeClass = getType<TypeClass>(parentType))
		{
			if(typeClass->proto)
				parentName = typeClass->proto->name;

			// Register type method
			if(const char *pos = strstr(function->name->name.begin, "::"))
			{
				typeClass->methods.push_back(function);
				typeClass->methodMap.insert(InplaceStr(pos + 2).hash(), function);
			}
		}

		if(name->name == parentName && function->type->returnType != ctx.typeVoid)
			Stop(ctx, errorLocation, "ERROR: type constructor return type must be 'void'");
	}

	VariableData *contextVariable = NULL;
	ExprVariableDefinition *contextVariableDefinition = NULL;

	if(parentType)
	{
		contextVariableDefinition = NULL;
	}
	else if(!coroutine && (ctx.scope == ctx.globalScope || ctx.scope->ownerNamespace))
	{
		contextVariableDefinition = NULL;
	}
	else if(prototype)
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(GetFunctionContextVariableName(ctx, function, ctx.GetFunctionIndex(function)));

		contextVariable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, refType->alignment, refType, nameIdentifier, 0, ctx.uniqueVariableId++);

		contextVariable->isAlloca = true;
		contextVariable->offset = ~0u;

		//function->contextVariable = context;

		ctx.AddVariable(contextVariable, true);

		contextVariableDefinition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, contextVariable), NULL);
	}
	else
	{
		contextVariable = CreateFunctionContextVariable(ctx, source, function, implementedPrototype);
		contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, implementedPrototype, contextVariable);
	}

	// If the type was deduced, implement prototype now that it's known
	if(ImplementPrototype(ctx, function))
	{
		TypeRef *refType = getType<TypeRef>(function->contextType);

		assert(refType);

		if(refType->subType != ctx.typeVoid)
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			assert(classType);

			if(!classType->members.empty())
				Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));
		}
	}

	// Time to make operator overload visible
	if(isOperator)
	{
		if(ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE)
			ctx.globalScope->idLookupMap.insert(function->name->name.hash(), IdentifierLookupResult(function));
		else
			ctx.scope->idLookupMap.insert(function->nameHash, IdentifierLookupResult(function));

		// TODO: more precise invalidation
		ctx.noAssignmentOperatorForTypePair.clear();

		ctx.noIndexOperatorForTypePair.clear();

		for(unsigned i = 0; i < ctx.noUnaryOperatorForTypePair.size(); i++)
			ctx.noUnaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noBinaryOperatorForTypePair.size(); i++)
			ctx.noBinaryOperatorForTypePair[i].clear();

		for(unsigned i = 0; i < ctx.noModifyOperatorForTypePair.size(); i++)
			ctx.noModifyOperatorForTypePair[i].clear();
	}

	FunctionData *conflict = CheckUniqueness(ctx, function);

	if(conflict)
	{
		Report(ctx, errorLocation, "ERROR: function '%.*s' is being defined with the same set of arguments", FMT_ISTR(function->name->name));

		char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

		const char *messageStart = errorCurr;

		errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "previous definition here");

		const char *messageEnd = errorCurr;

		AddRelatedErrorInfoWithLocation(ctx, conflict->source, messageStart, messageEnd);
	}

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, coroutineStateRead, code, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	return function->declaration;
}